

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall
Tokenizer::simpleWithEqOrDouble
          (Tokenizer *this,char c,TokenType type,TokenType typeEq,TokenType typeDouble)

{
  char cVar1;
  int iVar2;
  Mark *pMVar3;
  char in_SIL;
  Stream *in_RDI;
  Mark mark;
  Token *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  TokenType *in_stack_fffffffffffffe68;
  allocator<char> *type_00;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined8 local_171;
  allocator<char> local_111;
  string local_110 [111];
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [88];
  Mark local_28;
  char local_11;
  bool local_1;
  
  local_11 = in_SIL;
  pMVar3 = Stream::getMark(in_RDI);
  local_28 = *pMVar3;
  cVar1 = Stream::peek((Stream *)0x165be6);
  if (cVar1 == local_11) {
    iVar2 = Stream::advance((Stream *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))
    ;
    if (iVar2 == 0x3d) {
      iVar2 = (int)local_11;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffe70),(size_type)in_stack_fffffffffffffe68,
                 (char)((uint)in_stack_fffffffffffffe64 >> 0x18),
                 (allocator<char> *)in_stack_fffffffffffffe58);
      std::operator+(in_stack_fffffffffffffe58,
                     (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      Token::Token((Token *)CONCAT44(iVar2,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68,
                   (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (Mark *)in_stack_fffffffffffffe58);
      Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48);
      Token::~Token((Token *)0x165caf);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator(&local_a1);
      Stream::advance((Stream *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    else {
      cVar1 = Stream::peek((Stream *)0x165d5b);
      if (cVar1 == local_11) {
        iVar2 = (int)local_11;
        type_00 = &local_111;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),(size_type)type_00,
                   (char)((uint)iVar2 >> 0x18),(allocator<char> *)in_stack_fffffffffffffe58);
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (TokenType *)type_00,(string *)CONCAT44(iVar2,in_stack_fffffffffffffe60),
                     (Mark *)in_stack_fffffffffffffe58);
        Token::operator=((Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
        Token::~Token((Token *)0x165df3);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator(&local_111);
        Stream::advance((Stream *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
      else {
        iVar2 = (int)local_11;
        pMVar3 = (Mark *)&local_171;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   (size_type)in_stack_fffffffffffffe68,
                   (char)((uint)in_stack_fffffffffffffe64 >> 0x18),(allocator<char> *)pMVar3);
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68,
                     (string *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),pMVar3)
        ;
        Token::operator=((Token *)CONCAT44(iVar2,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
        Token::~Token((Token *)0x165ed8);
        std::__cxx11::string::~string((string *)((long)&local_171 + 1));
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tokenizer::simpleWithEqOrDouble(char c, TokenType type, TokenType typeEq, TokenType typeDouble)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == '=')
    {
      token_ = Token{typeEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else if(stream_.peek() == c)
    {
      token_ = Token{typeDouble, std::string(2, c), mark};
      stream_.advance();
    }
    else
      token_ = Token{type, std::string(1, c), mark};
  }
  else 
    return false;
  
  return true;
}